

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_scale(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  undefined1 auVar3 [64];
  int iVar4;
  ggml_tensor *pgVar5;
  int64_t iVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  byte bVar23;
  char cVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  char *pcVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined8 uVar34;
  void *pvVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int np;
  uint uVar39;
  ushort uVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  uint local_e0;
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xf35,"fatal error");
  }
  cVar24 = ggml_is_contiguous();
  if (cVar24 == '\0') {
    pcVar30 = "ggml_is_contiguous(src0)";
    uVar34 = 0xf06;
  }
  else {
    cVar24 = ggml_is_contiguous(dst);
    if (cVar24 == '\0') {
      pcVar30 = "ggml_is_contiguous(dst)";
      uVar34 = 0xf07;
    }
    else {
      cVar24 = ggml_are_same_shape(pgVar5,dst);
      if (cVar24 != '\0') {
        uVar39 = dst->op_params[0];
        iVar6 = pgVar5->ne[0];
        iVar4 = params->ith;
        iVar26 = params->nth;
        iVar25 = ggml_nrows(pgVar5);
        iVar26 = (iVar26 + -1 + iVar25) / iVar26;
        lVar36 = (long)iVar4 * (long)iVar26;
        iVar26 = iVar26 + (int)lVar36;
        if (iVar25 <= iVar26) {
          iVar26 = iVar25;
        }
        if ((int)lVar36 < iVar26) {
          sVar7 = pgVar5->nb[1];
          local_e0 = (uint)iVar6;
          lVar37 = (long)(int)local_e0;
          sVar8 = dst->nb[1];
          auVar41 = vbroadcastss_avx512f(ZEXT416(uVar39));
          auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          uVar39 = local_e0 & 0xffffffc0;
          lVar28 = (long)(int)uVar39;
          lVar38 = lVar37;
          if (lVar37 < lVar28 + 1) {
            lVar38 = lVar28 + 1;
          }
          lVar33 = sVar8 * lVar36;
          lVar32 = lVar33 + lVar28 * 4;
          auVar44 = vpbroadcastq_avx512f();
          auVar3 = vmovdqu64_avx512f(auVar44);
          do {
            pvVar35 = dst->data;
            if (pvVar35 != pgVar5->data) {
              memcpy((void *)((long)pvVar35 + lVar36 * sVar8),
                     (void *)((long)pgVar5->data + lVar36 * sVar7),lVar37 * 4);
              auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar44 = vmovdqu64_avx512f(auVar3);
              pvVar35 = dst->data;
            }
            if (0 < (int)uVar39) {
              lVar27 = (long)pvVar35 + lVar33;
              uVar29 = 0;
              do {
                lVar31 = 0;
                do {
                  auVar45 = vmulps_avx512f(auVar41,*(undefined1 (*) [64])(lVar27 + lVar31));
                  *(undefined1 (*) [64])(lVar27 + lVar31) = auVar45;
                  lVar31 = lVar31 + 0x40;
                } while (lVar31 != 0x100);
                uVar29 = uVar29 + 0x40;
                lVar27 = lVar27 + 0x100;
              } while (uVar29 < uVar39);
            }
            if (uVar39 != local_e0) {
              uVar29 = 0;
              do {
                auVar45 = vpbroadcastq_avx512f();
                auVar46 = vporq_avx512f(auVar45,auVar42);
                auVar45 = vporq_avx512f(auVar45,auVar43);
                uVar34 = vpcmpuq_avx512f(auVar45,auVar44,2);
                bVar22 = (byte)uVar34;
                uVar34 = vpcmpuq_avx512f(auVar46,auVar44,2);
                bVar23 = (byte)uVar34;
                uVar40 = CONCAT11(bVar23,bVar22);
                piVar1 = (int *)((long)pvVar35 + uVar29 * 4 + lVar32);
                auVar45._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * piVar1[1];
                auVar45._0_4_ = (uint)(bVar22 & 1) * *piVar1;
                auVar45._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * piVar1[2];
                auVar45._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * piVar1[3];
                auVar45._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * piVar1[4];
                auVar45._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * piVar1[5];
                auVar45._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * piVar1[6];
                auVar45._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * piVar1[7];
                auVar45._32_4_ = (uint)(bVar23 & 1) * piVar1[8];
                auVar45._36_4_ = (uint)(bVar23 >> 1 & 1) * piVar1[9];
                auVar45._40_4_ = (uint)(bVar23 >> 2 & 1) * piVar1[10];
                auVar45._44_4_ = (uint)(bVar23 >> 3 & 1) * piVar1[0xb];
                auVar45._48_4_ = (uint)(bVar23 >> 4 & 1) * piVar1[0xc];
                auVar45._52_4_ = (uint)(bVar23 >> 5 & 1) * piVar1[0xd];
                auVar45._56_4_ = (uint)(bVar23 >> 6 & 1) * piVar1[0xe];
                auVar45._60_4_ = (uint)(bVar23 >> 7) * piVar1[0xf];
                auVar45 = vmulps_avx512f(auVar41,auVar45);
                puVar2 = (uint *)((long)pvVar35 + uVar29 * 4 + lVar32);
                bVar9 = (bool)((byte)(uVar40 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
                bVar11 = (bool)((byte)(uVar40 >> 3) & 1);
                bVar12 = (bool)((byte)(uVar40 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar40 >> 5) & 1);
                bVar14 = (bool)((byte)(uVar40 >> 6) & 1);
                bVar15 = (bool)((byte)(uVar40 >> 7) & 1);
                bVar16 = (bool)(bVar23 >> 1 & 1);
                bVar17 = (bool)(bVar23 >> 2 & 1);
                bVar18 = (bool)(bVar23 >> 3 & 1);
                bVar19 = (bool)(bVar23 >> 4 & 1);
                bVar20 = (bool)(bVar23 >> 5 & 1);
                bVar21 = (bool)(bVar23 >> 6 & 1);
                *puVar2 = (uint)(bVar22 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar22 & 1) * *puVar2;
                puVar2[1] = (uint)bVar9 * auVar45._4_4_ | (uint)!bVar9 * puVar2[1];
                puVar2[2] = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * puVar2[2];
                puVar2[3] = (uint)bVar11 * auVar45._12_4_ | (uint)!bVar11 * puVar2[3];
                puVar2[4] = (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * puVar2[4];
                puVar2[5] = (uint)bVar13 * auVar45._20_4_ | (uint)!bVar13 * puVar2[5];
                puVar2[6] = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * puVar2[6];
                puVar2[7] = (uint)bVar15 * auVar45._28_4_ | (uint)!bVar15 * puVar2[7];
                puVar2[8] = (uint)(bVar23 & 1) * auVar45._32_4_ |
                            (uint)!(bool)(bVar23 & 1) * puVar2[8];
                puVar2[9] = (uint)bVar16 * auVar45._36_4_ | (uint)!bVar16 * puVar2[9];
                puVar2[10] = (uint)bVar17 * auVar45._40_4_ | (uint)!bVar17 * puVar2[10];
                puVar2[0xb] = (uint)bVar18 * auVar45._44_4_ | (uint)!bVar18 * puVar2[0xb];
                puVar2[0xc] = (uint)bVar19 * auVar45._48_4_ | (uint)!bVar19 * puVar2[0xc];
                puVar2[0xd] = (uint)bVar20 * auVar45._52_4_ | (uint)!bVar20 * puVar2[0xd];
                puVar2[0xe] = (uint)bVar21 * auVar45._56_4_ | (uint)!bVar21 * puVar2[0xe];
                puVar2[0xf] = (uint)(bVar23 >> 7) * auVar45._60_4_ |
                              (uint)!(bool)(bVar23 >> 7) * puVar2[0xf];
                uVar29 = uVar29 + 0x10;
              } while (((lVar38 - lVar28) + 0xfU & 0xfffffffffffffff0) != uVar29);
            }
            lVar36 = lVar36 + 1;
            lVar33 = lVar33 + sVar8;
            lVar32 = lVar32 + sVar8;
          } while (lVar36 != iVar26);
        }
        return;
      }
      pcVar30 = "ggml_are_same_shape(src0, dst)";
      uVar34 = 0xf08;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar34,"GGML_ASSERT(%s) failed",pcVar30);
}

Assistant:

void ggml_compute_forward_scale(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_scale_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}